

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

void __thiscall cfd::core::Psbt::Psbt(Psbt *this,uint32_t psbt_version,Transaction *transaction)

{
  wally_tx *tx_00;
  Transaction *this_00;
  int iVar1;
  uint32_t version;
  uint32_t locktime;
  CfdException *pCVar2;
  uint64_t satoshi;
  pointer pTVar3;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__x;
  pointer pTVar4;
  int ret;
  wally_tx *tx;
  wally_psbt *psbt_pointer;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txout_list;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> txin_list;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txid_val;
  TxInReference txin;
  string tx_hex;
  int local_19c;
  wally_tx *local_198;
  wally_psbt *local_190;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_188;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  Transaction *local_140;
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [2];
  undefined1 local_100 [24];
  undefined1 local_e8 [80];
  uint32_t local_98;
  undefined **local_90;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_88;
  Psbt *local_70;
  ByteData local_68;
  string local_50;
  
  this->_vptr_Psbt = (_func_int **)&PTR__Psbt_006a6830;
  local_140 = &this->base_tx_;
  local_70 = this;
  Transaction::Transaction(local_140);
  AbstractTransaction::GetHex_abi_cxx11_(&local_50,&transaction->super_AbstractTransaction);
  Transaction::GetTxInList(&local_170,transaction);
  Transaction::GetTxOutList(&local_188,transaction);
  local_198 = (wally_tx *)0x0;
  local_19c = wally_tx_from_hex(local_50._M_dataplus._M_p,0,&local_198);
  if (local_19c == 0) {
    if ((local_198->num_inputs !=
         ((long)local_170.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_170.
                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x71c71c71c71c71c7) ||
       (local_198->num_outputs !=
        ((long)local_188.
               super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_188.
               super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333)) {
      wally_tx_free(local_198);
      local_198 = (wally_tx *)0x0;
    }
  }
  else {
    local_100._0_8_ = "cfdcore_psbt.cpp";
    local_100._8_4_ = 0x727;
    local_100._16_8_ = (long)"MergePsbt" + 5;
    logger::log<int&>((CfdSourceLocation *)local_100,kCfdLogLevelWarning,"wally_tx_from_hex NG[{}]",
                      &local_19c);
    if ((local_170.
         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         local_170.
         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
         _M_impl.super__Vector_impl_data._M_finish) &&
       (local_188.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_188.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      local_100._0_8_ = local_100 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"psbt tx from hex error.","");
      CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_100);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  local_190 = (wally_psbt *)0x0;
  local_19c = wally_psbt_init_alloc
                        (psbt_version,
                         ((long)local_170.
                                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_170.
                                super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x71c71c71c71c71c7,
                         ((long)local_188.
                                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_188.
                                super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) *
                         -0x3333333333333333,0,&local_190);
  if (local_19c != 0) {
    local_100._0_8_ = "cfdcore_psbt.cpp";
    local_100._8_4_ = 0x739;
    local_100._16_8_ = (long)"MergePsbt" + 5;
    logger::log<int&>((CfdSourceLocation *)local_100,kCfdLogLevelWarning,
                      "wally_psbt_init_alloc NG[{}]",&local_19c);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_100._0_8_ = local_100 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"psbt data generate error.","");
    CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_100);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  iVar1 = 0;
  if (local_198 == (wally_tx *)0x0) {
    version = AbstractTransaction::GetVersion(&transaction->super_AbstractTransaction);
    locktime = AbstractTransaction::GetLockTime(&transaction->super_AbstractTransaction);
    local_19c = wally_tx_init_alloc(version,locktime,
                                    ((long)local_170.
                                           super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_170.
                                           super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                    -0x71c71c71c71c71c7,
                                    ((long)local_188.
                                           super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_188.
                                           super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                    -0x3333333333333333,&local_198);
    if (local_19c != 0) {
      wally_psbt_free(local_190);
      local_100._0_8_ = "cfdcore_psbt.cpp";
      local_100._8_4_ = 0x743;
      local_100._16_8_ = (long)"MergePsbt" + 5;
      logger::log<int&>((CfdSourceLocation *)local_100,kCfdLogLevelWarning,
                        "wally_psbt_set_global_tx NG[{}]",&local_19c);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      local_100._0_8_ = local_100 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"psbt set tx error.","")
      ;
      CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_100);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_19c = 0;
    if (local_170.
        super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_170.
        super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_19c = 0;
      __x = &((local_170.
               super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
               ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxInReference).
             script_witness_.witness_stack_;
      do {
        local_100._0_8_ = &PTR__AbstractTxInReference_00693f88;
        Txid::Txid((Txid *)(local_100 + 8),
                   (Txid *)&__x[-5].
                            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        local_e8._16_4_ =
             *(undefined4 *)
              &__x[-4].super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
        Script::Script((Script *)(local_e8 + 0x18),(Script *)(__x + -3));
        local_98 = *(uint32_t *)
                    &__x[-1].
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        local_90 = &PTR__ScriptWitness_006940e8;
        ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                  (&local_88,__x);
        local_100._0_8_ = &PTR__AbstractTxInReference_006a66a0;
        Txid::Txid((Txid *)local_138,(Txid *)(local_100 + 8));
        Txid::GetData(&local_68,(Txid *)local_138);
        ByteData::GetBytes(&local_158,&local_68);
        if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_138._0_8_ = &PTR__Txid_0068dcd8;
        if ((void *)CONCAT44(local_138._12_4_,local_138._8_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_138._12_4_,local_138._8_4_));
        }
        local_19c = wally_tx_add_raw_input
                              (local_198,
                               local_158.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,local_e8._16_4_,
                               local_98,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,0);
        if (local_19c != 0) {
          wally_tx_free(local_198);
          wally_psbt_free(local_190);
          local_138._0_8_ = "cfdcore_psbt.cpp";
          local_138._8_4_ = 0x74f;
          local_128[0]._M_allocated_capacity = (long)"MergePsbt" + 5;
          logger::log<int&>((CfdSourceLocation *)local_138,kCfdLogLevelWarning,
                            "wally_tx_add_raw_input NG[{}]",&local_19c);
          pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
          local_138._0_8_ = local_128;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,"psbt set tx input error.","");
          CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_138);
          __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_158.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        AbstractTxInReference::~AbstractTxInReference((AbstractTxInReference *)local_100);
        pTVar4 = (pointer)(__x + 1);
        __x = __x + 6;
      } while (pTVar4 != local_170.
                         super__Vector_base<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    iVar1 = local_19c;
    if (local_188.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_188.
        super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pTVar3 = local_188.
               super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_100._0_8_ = &PTR__AbstractTxOutReference_00693fb8;
        local_100._8_8_ = (pTVar3->super_AbstractTxOutReference).value_.amount_;
        local_100._16_8_ =
             *(undefined8 *)&(pTVar3->super_AbstractTxOutReference).value_.ignore_check_;
        Script::Script((Script *)local_e8,&(pTVar3->super_AbstractTxOutReference).locking_script_);
        local_100._0_8_ = &PTR__AbstractTxOutReference_006a6660;
        Script::Script((Script *)local_138,(Script *)local_e8);
        Script::GetData(&local_68,(Script *)local_138);
        ByteData::GetBytes(&local_158,&local_68);
        if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        Script::~Script((Script *)local_138);
        tx_00 = local_198;
        local_138._0_8_ = local_100._8_8_;
        local_138[8] = local_100[0x10];
        satoshi = Amount::GetSatoshiValue((Amount *)local_138);
        local_19c = wally_tx_add_raw_output
                              (tx_00,satoshi,
                               local_158.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                               (long)local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_158.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,0);
        if (local_19c != 0) {
          wally_tx_free(local_198);
          wally_psbt_free(local_190);
          local_138._0_8_ = "cfdcore_psbt.cpp";
          local_138._8_4_ = 0x75b;
          local_128[0]._M_allocated_capacity = (long)"MergePsbt" + 5;
          logger::log<int&>((CfdSourceLocation *)local_138,kCfdLogLevelWarning,
                            "wally_tx_add_raw_output NG[{}]",&local_19c);
          pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
          local_138._0_8_ = local_128;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,"psbt set tx output error.","");
          CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_138);
          __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_158.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_100._0_8_ = &PTR__AbstractTxOutReference_00693fb8;
        Script::~Script((Script *)local_e8);
        pTVar3 = pTVar3 + 1;
        iVar1 = local_19c;
      } while (pTVar3 != local_188.
                         super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  local_19c = iVar1;
  this_00 = local_140;
  local_19c = wally_psbt_set_global_tx(local_190,local_198);
  wally_tx_free(local_198);
  if (local_19c == 0) {
    local_70->wally_psbt_pointer_ = local_190;
    RebuildTransaction((Transaction *)local_100,local_190);
    Transaction::operator=(this_00,(Transaction *)local_100);
    Transaction::~Transaction((Transaction *)local_100);
    ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
              (&local_188);
    ::std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
              (&local_170);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return;
  }
  wally_psbt_free(local_190);
  local_100._0_8_ = "cfdcore_psbt.cpp";
  local_100._8_4_ = 0x765;
  local_100._16_8_ = (long)"MergePsbt" + 5;
  logger::log<int&>((CfdSourceLocation *)local_100,kCfdLogLevelWarning,
                    "wally_psbt_set_global_tx NG[{}]",&local_19c);
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  local_100._0_8_ = local_100 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"psbt set tx error.","");
  CfdException::CfdException(pCVar2,kCfdInternalError,(string *)local_100);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, const Transaction &transaction) {
  std::string tx_hex = transaction.GetHex();
  auto txin_list = transaction.GetTxInList();
  auto txout_list = transaction.GetTxOutList();
  struct wally_tx *tx = nullptr;
  int ret = wally_tx_from_hex(tx_hex.data(), 0, &tx);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}]", ret);
    if (txin_list.empty() || txout_list.empty()) {
      // fall-through
    } else {
      throw CfdException(kCfdInternalError, "psbt tx from hex error.");
    }
  } else if (
      (tx->num_inputs != txin_list.size()) ||
      (tx->num_outputs != txout_list.size())) {
    // free and direct creating.
    wally_tx_free(tx);
    tx = nullptr;
  }

  struct wally_psbt *psbt_pointer = nullptr;
  ret = wally_psbt_init_alloc(
      psbt_version, txin_list.size(), txout_list.size(), 0, &psbt_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_init_alloc NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt data generate error.");
  }

  if (tx == nullptr) {
    ret = wally_tx_init_alloc(
        transaction.GetVersion(), transaction.GetLockTime(), txin_list.size(),
        txout_list.size(), &tx);
    if (ret != WALLY_OK) {
      wally_psbt_free(psbt_pointer);  // free
      warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
      throw CfdException(kCfdInternalError, "psbt set tx error.");
    }

    for (auto txin : txin_list) {
      auto txid_val = txin.GetTxid().GetData().GetBytes();
      ret = wally_tx_add_raw_input(
          tx, txid_val.data(), txid_val.size(), txin.GetVout(),
          txin.GetSequence(), nullptr, 0, nullptr, 0);
      if (ret != WALLY_OK) {
        wally_tx_free(tx);
        wally_psbt_free(psbt_pointer);  // free
        warn(CFD_LOG_SOURCE, "wally_tx_add_raw_input NG[{}]", ret);
        throw CfdException(kCfdInternalError, "psbt set tx input error.");
      }
    }
    for (auto txout : txout_list) {
      auto script_val = txout.GetLockingScript().GetData().GetBytes();
      ret = wally_tx_add_raw_output(
          tx, static_cast<uint64_t>(txout.GetValue().GetSatoshiValue()),
          script_val.data(), script_val.size(), 0);
      if (ret != WALLY_OK) {
        wally_tx_free(tx);
        wally_psbt_free(psbt_pointer);  // free
        warn(CFD_LOG_SOURCE, "wally_tx_add_raw_output NG[{}]", ret);
        throw CfdException(kCfdInternalError, "psbt set tx output error.");
      }
    }
  }

  ret = wally_psbt_set_global_tx(psbt_pointer, tx);
  wally_tx_free(tx);
  if (ret != WALLY_OK) {
    wally_psbt_free(psbt_pointer);  // free
    warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt set tx error.");
  }
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}